

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O1

int Res(N_Vector ycor,N_Vector f,void *mem)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  double dVar7;
  int iVar8;
  
  if (mem == (void *)0x0) {
    printf("ERROR: Integrator memory is NULL");
    iVar8 = -1;
  }
  else {
    N_VLinearSum(0x3ff0000000000000,0,*mem,*(undefined8 *)((long)mem + 0x10),
                 *(undefined8 *)((long)mem + 8));
    pdVar4 = *(double **)(**(long **)((long)mem + 8) + 0x10);
    dVar1 = *pdVar4;
    dVar2 = pdVar4[2];
    pdVar5 = *(double **)((long)f->content + 0x10);
    dVar3 = pdVar4[1];
    *pdVar5 = dVar2 * dVar2 + dVar1 * dVar1 + dVar3 * dVar3 + -1.0;
    dVar7 = dVar2 * dVar2 + dVar1 * dVar1 * 3.0 + dVar3 * -4.0;
    auVar6._8_4_ = SUB84(dVar7,0);
    auVar6._0_8_ = dVar2 * -4.0 + dVar1 * dVar1 * 2.0 + dVar3 * dVar3;
    auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
    *(undefined1 (*) [16])(pdVar5 + 1) = auVar6;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int Res(N_Vector ycor, N_Vector f, void* mem)
{
  IntegratorMem Imem;
  sunrealtype y1, y2, y3;

  if (mem == NULL)
  {
    printf("ERROR: Integrator memory is NULL");
    return (-1);
  }
  Imem = (IntegratorMem)mem;

  /* update state based on current correction */
  N_VLinearSum(ONE, Imem->y0, ONE, Imem->ycor, Imem->ycur);

  /* get vector components */
  y1 = NV_Ith_S(Imem->ycur, 0);
  y2 = NV_Ith_S(Imem->ycur, 1);
  y3 = NV_Ith_S(Imem->ycur, 2);

  /* compute the residual function */
  NV_Ith_S(f, 0) = y1 * y1 + y2 * y2 + y3 * y3 - ONE;
  NV_Ith_S(f, 1) = TWO * y1 * y1 + y2 * y2 - FOUR * y3;
  NV_Ith_S(f, 2) = THREE * (y1 * y1) - FOUR * y2 + y3 * y3;

  /* return success */
  return (0);
}